

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

int xmlIsMixedElement(xmlDocPtr doc,xmlChar *name)

{
  xmlElementTypeVal xVar1;
  xmlElementPtr local_28;
  xmlElementPtr elemDecl;
  xmlChar *name_local;
  xmlDocPtr doc_local;
  
  if ((doc == (xmlDocPtr)0x0) || (doc->intSubset == (_xmlDtd *)0x0)) {
    doc_local._4_4_ = -1;
  }
  else {
    local_28 = xmlGetDtdElementDesc(doc->intSubset,name);
    if ((local_28 == (xmlElementPtr)0x0) && (doc->extSubset != (_xmlDtd *)0x0)) {
      local_28 = xmlGetDtdElementDesc(doc->extSubset,name);
    }
    if (local_28 == (xmlElementPtr)0x0) {
      doc_local._4_4_ = -1;
    }
    else {
      xVar1 = local_28->etype;
      if (xVar1 == XML_ELEMENT_TYPE_UNDEFINED) {
        doc_local._4_4_ = -1;
      }
      else if (xVar1 - XML_ELEMENT_TYPE_EMPTY < 3) {
        doc_local._4_4_ = 1;
      }
      else if (xVar1 == XML_ELEMENT_TYPE_ELEMENT) {
        doc_local._4_4_ = 0;
      }
      else {
        doc_local._4_4_ = 1;
      }
    }
  }
  return doc_local._4_4_;
}

Assistant:

int
xmlIsMixedElement(xmlDocPtr doc, const xmlChar *name) {
    xmlElementPtr elemDecl;

    if ((doc == NULL) || (doc->intSubset == NULL)) return(-1);

    elemDecl = xmlGetDtdElementDesc(doc->intSubset, name);
    if ((elemDecl == NULL) && (doc->extSubset != NULL))
	elemDecl = xmlGetDtdElementDesc(doc->extSubset, name);
    if (elemDecl == NULL) return(-1);
    switch (elemDecl->etype) {
	case XML_ELEMENT_TYPE_UNDEFINED:
	    return(-1);
	case XML_ELEMENT_TYPE_ELEMENT:
	    return(0);
        case XML_ELEMENT_TYPE_EMPTY:
	    /*
	     * return 1 for EMPTY since we want VC error to pop up
	     * on <empty>     </empty> for example
	     */
	case XML_ELEMENT_TYPE_ANY:
	case XML_ELEMENT_TYPE_MIXED:
	    return(1);
    }
    return(1);
}